

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::CheckFieldIndex(FieldDescriptor *field,int index)

{
  ushort *puVar1;
  bool bVar2;
  LogMessage *pLVar3;
  string_view v;
  string_view v_00;
  LogMessage LStack_28;
  
  if (field != (FieldDescriptor *)0x0) {
    bVar2 = FieldDescriptor::is_repeated(field);
    if (index == -1 && bVar2) {
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,0xc4);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (&LStack_28,
                          (char (*) [50])"Index must be in range of repeated field values. ");
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [8])"Field: ");
      puVar1 = (ushort *)(field->all_names_).payload_;
      v._M_len = (ulong)*puVar1;
      v._M_str = (char *)((long)puVar1 + ~v._M_len);
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v);
    }
    else {
      bVar2 = FieldDescriptor::is_repeated(field);
      if (bVar2 || index == -1) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                ((LogMessageDebugFatal *)&LStack_28,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
                 ,199);
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (&LStack_28,(char (*) [38])"Index must be -1 for singular fields.");
      pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar3,(char (*) [8])"Field: ");
      puVar1 = (ushort *)(field->all_names_).payload_;
      v_00._M_len = (ulong)*puVar1;
      v_00._M_str = (char *)((long)puVar1 + ~v_00._M_len);
      absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar3,v_00);
    }
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&LStack_28);
  }
  return;
}

Assistant:

void CheckFieldIndex(const FieldDescriptor* field, int index) {
  if (field == nullptr) {
    return;
  }

  if (field->is_repeated() && index == -1) {
    ABSL_DLOG(FATAL) << "Index must be in range of repeated field values. "
                     << "Field: " << field->name();
  } else if (!field->is_repeated() && index != -1) {
    ABSL_DLOG(FATAL) << "Index must be -1 for singular fields."
                     << "Field: " << field->name();
  }
}